

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O0

void Hop_ManAddMemory(Hop_Man_t *p)

{
  void *Entry;
  int local_1c;
  int nBytes;
  int i;
  char *pMemory;
  Hop_Man_t *p_local;
  
  if (p->pListFree == (Hop_Obj_t *)0x0) {
    Entry = malloc(0x28040);
    Vec_PtrPush(p->vChunks,Entry);
    _nBytes = (Hop_Obj_t *)((long)Entry + (0x40 - (long)(int)((uint)Entry & 0x3f)));
    Vec_PtrPush(p->vPages,_nBytes);
    p->pListFree = _nBytes;
    for (local_1c = 1; local_1c < 0x1000; local_1c = local_1c + 1) {
      (_nBytes->field_0).pData = _nBytes + 1;
      _nBytes = _nBytes + 1;
    }
    (_nBytes->field_0).pData = (void *)0x0;
    return;
  }
  __assert_fail("p->pListFree == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopMem.c"
                ,0x5e,"void Hop_ManAddMemory(Hop_Man_t *)");
}

Assistant:

void Hop_ManAddMemory( Hop_Man_t * p )
{
    char * pMemory;
    int i, nBytes;
    assert( sizeof(Hop_Obj_t) <= 64 );
    assert( p->pListFree == NULL );
//    assert( (Hop_ManObjNum(p) & IVY_PAGE_MASK) == 0 );
    // allocate new memory page
    nBytes = sizeof(Hop_Obj_t) * (1<<IVY_PAGE_SIZE) + 64;
    pMemory = ABC_ALLOC( char, nBytes );
    Vec_PtrPush( p->vChunks, pMemory );
    // align memory at the 32-byte boundary
    pMemory = pMemory + 64 - (((int)(ABC_PTRUINT_T)pMemory) & 63);
    // remember the manager in the first entry
    Vec_PtrPush( p->vPages, pMemory );
    // break the memory down into nodes
    p->pListFree = (Hop_Obj_t *)pMemory;
    for ( i = 1; i <= IVY_PAGE_MASK; i++ )
    {
        *((char **)pMemory) = pMemory + sizeof(Hop_Obj_t);
        pMemory += sizeof(Hop_Obj_t);
    }
    *((char **)pMemory) = NULL;
}